

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O0

bool __thiscall
wallet::DatabaseBatch::
Read<std::pair<std::__cxx11::string,CPubKey>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (DatabaseBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
          *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  byte bVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  exception *anon_var_0;
  DataStream ssValue;
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff48);
  DataStream::reserve(in_stack_ffffffffffffff48,0xb7b919);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff48);
  bVar1 = (**(code **)*in_RDI)(in_RDI,&local_28,&local_48);
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    DataStream::operator>>
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff50);
  }
  DataStream::~DataStream(in_stack_ffffffffffffff48);
  DataStream::~DataStream(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Read(const K& key, T& value)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        DataStream ssValue{};
        if (!ReadKey(std::move(ssKey), ssValue)) return false;
        try {
            ssValue >> value;
            return true;
        } catch (const std::exception&) {
            return false;
        }
    }